

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

void __thiscall
cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::rules_holder
          (rules_holder<cppcms::xss::compare_c_string,_true> *this)

{
  undefined8 *in_RDI;
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [16];
  string *in_stack_ffffffffffffff88;
  basic_rules_holder *in_stack_ffffffffffffff90;
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  basic_rules_holder::basic_rules_holder((basic_rules_holder *)0x460811);
  *in_RDI = &PTR_add_tag_0052fc78;
  std::
  map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>_>
  ::map((map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>_>
         *)0x460832);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"lt",&local_29);
  basic_rules_holder::add_entity(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"gt",&local_61);
  basic_rules_holder::add_entity(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"amp",&local_89);
  basic_rules_holder::add_entity(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"quot",&local_b1);
  basic_rules_holder::add_entity(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  return;
}

Assistant:

rules_holder()
		{
			add_entity("lt");
			add_entity("gt");
			add_entity("amp");
			add_entity("quot");
		}